

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *this;
  PropertyExprSyntax *args_1;
  ClockingPropertyExprSyntax *pCVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  PropertyExprSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::TimingControlSyntax_*>::operator*
            ((not_null<slang::syntax::TimingControlSyntax_*> *)0xa2f086);
  this = (BumpAllocator *)
         deepClone<slang::syntax::TimingControlSyntax>
                   ((TimingControlSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (PropertyExprSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::PropertyExprSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::PropertyExprSyntax*>
                     (this,(TimingControlSyntax *)__child_stack,(PropertyExprSyntax **)args_1);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingPropertyExprSyntax>(
        *deepClone<TimingControlSyntax>(*node.event, alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}